

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O2

Vec_Int_t * Acec_ManCollectXorRoots(Gia_Man_t *p,Vec_Int_t *vXors)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Bit_t *p_01;
  int iVar2;
  
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_BitStart(p->nObjs);
  for (iVar2 = 3; iVar1 = vXors->nSize, iVar2 + -3 < iVar1; iVar2 = iVar2 + 4) {
    iVar1 = Vec_IntEntry(vXors,iVar2 + -2);
    Vec_BitWriteEntry(p_01,iVar1,1);
    iVar1 = Vec_IntEntry(vXors,iVar2 + -1);
    Vec_BitWriteEntry(p_01,iVar1,1);
    iVar1 = Vec_IntEntry(vXors,iVar2);
    Vec_BitWriteEntry(p_01,iVar1,1);
  }
  for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 4) {
    iVar1 = Vec_IntEntry(vXors,iVar2);
    iVar1 = Vec_BitEntry(p_01,iVar1);
    if (iVar1 == 0) {
      iVar1 = Vec_IntEntry(vXors,iVar2);
      Vec_IntPush(p_00,iVar1);
    }
    iVar1 = vXors->nSize;
  }
  Vec_BitFree(p_01);
  return p_00;
}

Assistant:

Vec_Int_t * Acec_ManCollectXorRoots( Gia_Man_t * p, Vec_Int_t * vXors )
{
    Vec_Int_t * vXorRoots = Vec_IntAlloc( 100 );
    Vec_Bit_t * vIns = Vec_BitStart( Gia_ManObjNum(p) );  int i;
    // marks box inputs
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
    {
        Vec_BitWriteEntry( vIns, Vec_IntEntry(vXors, 4*i+1), 1 );
        Vec_BitWriteEntry( vIns, Vec_IntEntry(vXors, 4*i+2), 1 );
        Vec_BitWriteEntry( vIns, Vec_IntEntry(vXors, 4*i+3), 1 );
    }
    // collect roots
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
        if ( !Vec_BitEntry(vIns, Vec_IntEntry(vXors, 4*i)) )
            Vec_IntPush( vXorRoots, Vec_IntEntry(vXors, 4*i) );
    Vec_BitFree( vIns );
    return vXorRoots;
}